

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::anon_unknown_14::XmlReporter::log_assert(XmlReporter *this,AssertData *rb)

{
  XmlWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  Enum EVar4;
  char *pcVar5;
  _Alloc_hider this_01;
  undefined8 uVar6;
  String *pSVar7;
  _Alloc_hider unaff_R14;
  string local_e8;
  string local_c8;
  string local_a8;
  pthread_mutex_t *local_88;
  XmlReporter *local_80;
  string local_78;
  uint local_54;
  string local_50;
  
  if ((rb->m_failed != false) || (this->opt->success == true)) {
    local_88 = (pthread_mutex_t *)&this->mutex;
    iVar3 = pthread_mutex_lock(local_88);
    if (iVar3 != 0) {
      uVar6 = std::__throw_system_error(iVar3);
      if ((XmlReporter *)local_c8._M_dataplus._M_p != this) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        unaff_R14._M_p = local_a8._M_dataplus._M_p;
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)unaff_R14._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      pthread_mutex_unlock(local_88);
      _Unwind_Resume(uVar6);
    }
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Expression","");
    this_00 = &this->xml;
    XmlWriter::startElement(this_00,&local_e8);
    paVar1 = &local_c8.field_2;
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"success","");
    XmlWriter::writeAttribute(this_00,&local_c8,(bool)(rb->m_failed ^ 1));
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"type","");
    pcVar5 = assertString(rb->m_at);
    XmlWriter::writeAttribute(this_00,&local_a8,pcVar5);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"filename","");
    local_80 = this;
    pcVar5 = skipPathFromFilename(rb->m_file);
    XmlWriter::writeAttribute(this_00,&local_78,pcVar5);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"line","");
    local_54 = 0;
    if (local_80->opt->no_line_numbers == false) {
      local_54 = rb->m_line;
    }
    XmlWriter::writeAttribute<unsigned_int>(this_00,&local_50,&local_54);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_e8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    local_e8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Original","");
    local_a8._M_dataplus._M_p = &this_00->m_tagIsOpen;
    XmlWriter::startElement(this_00,&local_e8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,rb->m_expr,(allocator<char> *)&local_78);
    XmlWriter::ScopedElement::writeText((ScopedElement *)&local_a8,&local_c8,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (rb->m_threw == true) {
      local_e8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Exception","");
      local_a8._M_dataplus._M_p = &this_00->m_tagIsOpen;
      XmlWriter::startElement(this_00,&local_e8);
      if ((rb->m_exception).field_0.buf[0x17] < '\0') {
        pSVar7 = (String *)(rb->m_exception).field_0.data.ptr;
      }
      else {
        pSVar7 = &rb->m_exception;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,(char *)pSVar7,(allocator<char> *)&local_78);
      XmlWriter::ScopedElement::writeText((ScopedElement *)&local_a8,&local_c8,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
    }
    EVar4 = rb->m_at;
    if ((EVar4 & is_throws_as) != 0) {
      local_e8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ExpectedException","");
      local_a8._M_dataplus._M_p = &this_00->m_tagIsOpen;
      XmlWriter::startElement(this_00,&local_e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,rb->m_exception_type,(allocator<char> *)&local_78);
      XmlWriter::ScopedElement::writeText((ScopedElement *)&local_a8,&local_c8,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      EVar4 = rb->m_at;
    }
    if ((EVar4 & is_throws_with) != 0) {
      local_e8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"ExpectedExceptionString","");
      local_a8._M_dataplus._M_p = &this_00->m_tagIsOpen;
      XmlWriter::startElement(this_00,&local_e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,rb->m_exception_string,(allocator<char> *)&local_78);
      XmlWriter::ScopedElement::writeText((ScopedElement *)&local_a8,&local_c8,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      EVar4 = rb->m_at;
    }
    if (((EVar4 & is_normal) != 0) && (rb->m_threw == false)) {
      local_e8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Expanded","");
      local_a8._M_dataplus._M_p = &this_00->m_tagIsOpen;
      XmlWriter::startElement(this_00,&local_e8);
      if ((rb->m_decomp).field_0.buf[0x17] < '\0') {
        pSVar7 = (String *)(rb->m_decomp).field_0.data.ptr;
      }
      else {
        pSVar7 = &rb->m_decomp;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,(char *)pSVar7,(allocator<char> *)&local_78);
      XmlWriter::ScopedElement::writeText((ScopedElement *)&local_a8,&local_c8,true);
      this_01._M_p = &this_00->m_tagIsOpen;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        this_01._M_p = local_a8._M_dataplus._M_p;
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)this_01._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
    }
    log_contexts(local_80);
    XmlWriter::endElement(this_00);
    pthread_mutex_unlock(local_88);
  }
  return;
}

Assistant:

void log_assert(const AssertData& rb) override {
            if(!rb.m_failed && !opt.success)
                return;

            std::lock_guard<std::mutex> lock(mutex);

            xml.startElement("Expression")
                    .writeAttribute("success", !rb.m_failed)
                    .writeAttribute("type", assertString(rb.m_at))
                    .writeAttribute("filename", skipPathFromFilename(rb.m_file))
                    .writeAttribute("line", line(rb.m_line));

            xml.scopedElement("Original").writeText(rb.m_expr);

            if(rb.m_threw)
                xml.scopedElement("Exception").writeText(rb.m_exception.c_str());

            if(rb.m_at & assertType::is_throws_as)
                xml.scopedElement("ExpectedException").writeText(rb.m_exception_type);
            if(rb.m_at & assertType::is_throws_with)
                xml.scopedElement("ExpectedExceptionString").writeText(rb.m_exception_string);
            if((rb.m_at & assertType::is_normal) && !rb.m_threw)
                xml.scopedElement("Expanded").writeText(rb.m_decomp.c_str());

            log_contexts();

            xml.endElement();
        }